

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CFG.cpp
# Opt level: O1

void __thiscall CFG::addEdge(CFG *this,CfgNode *src,CfgNode *dst,unsigned_long_long count)

{
  _Rb_tree_header *p_Var1;
  CfgEdge *this_00;
  _Rb_tree<CfgNode*,CfgNode*,std::_Identity<CfgNode*>,std::less<CfgNode*>,std::allocator<CfgNode*>>
  *p_Var2;
  _Base_ptr p_Var3;
  _Base_ptr p_Var4;
  CfgEdge *edge;
  CfgEdge *local_40;
  CfgNode *local_38;
  CfgNode *local_30;
  
  local_38 = dst;
  local_30 = src;
  if (src != (CfgNode *)0x0) {
    p_Var1 = &(this->m_nodes)._M_t._M_impl.super__Rb_tree_header;
    p_Var4 = (this->m_nodes)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
    p_Var3 = &p_Var1->_M_header;
    for (; p_Var4 != (_Base_ptr)0x0; p_Var4 = (&p_Var4->_M_left)[*(CfgNode **)(p_Var4 + 1) < src]) {
      if (*(CfgNode **)(p_Var4 + 1) >= src) {
        p_Var3 = p_Var4;
      }
    }
    p_Var4 = &p_Var1->_M_header;
    if (((_Rb_tree_header *)p_Var3 != p_Var1) && (p_Var4 = p_Var3, src < *(CfgNode **)(p_Var3 + 1)))
    {
      p_Var4 = &p_Var1->_M_header;
    }
    if ((_Rb_tree_header *)p_Var4 != p_Var1) {
      if (dst != (CfgNode *)0x0) {
        p_Var1 = &(this->m_nodes)._M_t._M_impl.super__Rb_tree_header;
        p_Var4 = (this->m_nodes)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
        p_Var3 = &p_Var1->_M_header;
        for (; p_Var4 != (_Base_ptr)0x0;
            p_Var4 = (&p_Var4->_M_left)[*(CfgNode **)(p_Var4 + 1) < dst]) {
          if (*(CfgNode **)(p_Var4 + 1) >= dst) {
            p_Var3 = p_Var4;
          }
        }
        p_Var4 = &p_Var1->_M_header;
        if (((_Rb_tree_header *)p_Var3 != p_Var1) &&
           (p_Var4 = p_Var3, dst < *(CfgNode **)(p_Var3 + 1))) {
          p_Var4 = &p_Var1->_M_header;
        }
        if ((_Rb_tree_header *)p_Var4 != p_Var1) {
          local_40 = findEdge(this,src,dst);
          if (local_40 == (CfgEdge *)0x0) {
            this_00 = (CfgEdge *)operator_new(0x20);
            CfgEdge::CfgEdge(this_00,src,dst,count);
            local_40 = this_00;
            std::
            _Rb_tree<CfgEdge*,CfgEdge*,std::_Identity<CfgEdge*>,std::less<CfgEdge*>,std::allocator<CfgEdge*>>
            ::_M_insert_unique<CfgEdge*const&>
                      ((_Rb_tree<CfgEdge*,CfgEdge*,std::_Identity<CfgEdge*>,std::less<CfgEdge*>,std::allocator<CfgEdge*>>
                        *)&this->m_edges,&local_40);
            p_Var2 = (_Rb_tree<CfgNode*,CfgNode*,std::_Identity<CfgNode*>,std::less<CfgNode*>,std::allocator<CfgNode*>>
                      *)std::
                        map<CfgNode_*,_std::set<CfgNode_*,_std::less<CfgNode_*>,_std::allocator<CfgNode_*>_>,_std::less<CfgNode_*>,_std::allocator<std::pair<CfgNode_*const,_std::set<CfgNode_*,_std::less<CfgNode_*>,_std::allocator<CfgNode_*>_>_>_>_>
                        ::operator[](&this->m_succs,&local_30);
            std::
            _Rb_tree<CfgNode*,CfgNode*,std::_Identity<CfgNode*>,std::less<CfgNode*>,std::allocator<CfgNode*>>
            ::_M_insert_unique<CfgNode*const&>(p_Var2,&local_38);
            p_Var2 = (_Rb_tree<CfgNode*,CfgNode*,std::_Identity<CfgNode*>,std::less<CfgNode*>,std::allocator<CfgNode*>>
                      *)std::
                        map<CfgNode_*,_std::set<CfgNode_*,_std::less<CfgNode_*>,_std::allocator<CfgNode_*>_>,_std::less<CfgNode_*>,_std::allocator<std::pair<CfgNode_*const,_std::set<CfgNode_*,_std::less<CfgNode_*>,_std::allocator<CfgNode_*>_>_>_>_>
                        ::operator[](&this->m_preds,&local_38);
            std::
            _Rb_tree<CfgNode*,CfgNode*,std::_Identity<CfgNode*>,std::less<CfgNode*>,std::allocator<CfgNode*>>
            ::_M_insert_unique<CfgNode*const&>(p_Var2,&local_30);
            this->m_status = UNCHECKED;
          }
          else {
            local_40->m_count = local_40->m_count + count;
          }
          return;
        }
      }
      __assert_fail("dst != 0 && this->containsNode(dst)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/rimsa[P]cfgconv/src/CFG.cpp"
                    ,0x6c,"void CFG::addEdge(CfgNode *, CfgNode *, unsigned long long)");
    }
  }
  __assert_fail("src != 0 && this->containsNode(src)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/rimsa[P]cfgconv/src/CFG.cpp"
                ,0x6b,"void CFG::addEdge(CfgNode *, CfgNode *, unsigned long long)");
}

Assistant:

void CFG::addEdge(CfgNode* src, CfgNode* dst, unsigned long long count) {
	assert(src != 0 && this->containsNode(src));
	assert(dst != 0 && this->containsNode(dst));

	CfgEdge* edge = this->findEdge(src, dst);
	if (edge)
		// Update edge count if already added.
		edge->updateCount(count);
	else {
		// Create and add edge.
		edge = new CfgEdge(src, dst, count);
		m_edges.insert(edge);

		m_succs[src].insert(dst);
		m_preds[dst].insert(src);

		m_status = CFG::UNCHECKED;
	}
}